

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

bool __thiscall Moc::parseMaybeFunction(Moc *this,ClassDef *cdef,FunctionDef *def)

{
  long lVar1;
  byte bVar2;
  char (*pacVar3) [59];
  QArrayData *pQVar4;
  undefined1 *puVar5;
  QArrayData *pQVar6;
  QByteArray *pQVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 data;
  undefined8 uVar13;
  bool bVar14;
  bool bVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  undefined1 local_c8 [56];
  undefined1 *puStack_90;
  undefined1 local_88 [56];
  undefined1 *puStack_50;
  undefined2 local_3b;
  undefined1 local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  def->isVirtual = false;
  def->isStatic = false;
  do {
    do {
      bVar14 = testForFunctionModifiers(this,def);
    } while (bVar14);
    bVar14 = skipCxxAttributes(this);
  } while (((bVar14) || (bVar14 = testFunctionAttribute(this,def), bVar14)) ||
          (bVar14 = testFunctionRevision(this,def), bVar14));
  lVar16 = (this->super_Parser).index;
  if ((lVar16 < (this->super_Parser).symbols.d.size) &&
     ((this->super_Parser).symbols.d.ptr[lVar16].token == PP_TILDE)) {
    (this->super_Parser).index = lVar16 + 1;
    bVar14 = true;
  }
  else {
    bVar14 = false;
  }
  parseType((Type *)local_88,this);
  pQVar6 = &((def->type).name.d.d)->super_QArrayData;
  pQVar7 = (QByteArray *)(def->type).name.d.ptr;
  (def->type).name.d.d = (Data *)local_88._0_8_;
  (def->type).name.d.ptr = (char *)local_88._8_8_;
  pacVar3 = (char (*) [59])(def->type).name.d.size;
  (def->type).name.d.size = local_88._16_8_;
  pQVar4 = &((def->type).rawName.d.d)->super_QArrayData;
  pcVar17 = (def->type).rawName.d.ptr;
  (def->type).rawName.d.d = (Data *)local_88._24_8_;
  (def->type).rawName.d.ptr = (char *)local_88._32_8_;
  puVar5 = (undefined1 *)(def->type).rawName.d.size;
  (def->type).rawName.d.size = local_88._40_8_;
  *(undefined8 *)&(def->type).field_0x30 = local_88._48_8_;
  *(undefined1 **)&(def->type).firstToken = puStack_50;
  local_88._0_8_ = pQVar6;
  local_88._8_8_ = pQVar7;
  local_88._16_8_ = pacVar3;
  local_88._24_8_ = pQVar4;
  local_88._32_8_ = pcVar17;
  local_88._40_8_ = puVar5;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,1,0x10);
    }
  }
  if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
    }
  }
  if ((def->type).name.d.size != 0) {
    pQVar7 = &(def->type).rawName;
    lVar16 = (this->super_Parser).index;
    if ((lVar16 < (this->super_Parser).symbols.d.size) &&
       ((this->super_Parser).symbols.d.ptr[lVar16].token == LPAREN)) {
      (this->super_Parser).index = lVar16 + 1;
      QByteArray::operator=(&def->name,(QByteArray *)def);
      bVar2 = (def->type).field_0x30;
      bVar15 = operator==(&def->name,(QByteArray *)cdef);
      if (bVar15) {
        def->isDestructor = bVar14;
        def->isConstructor = (bool)(bVar14 ^ 1);
        pQVar4 = &((def->type).name.d.d)->super_QArrayData;
        pQVar6 = &((def->type).rawName.d.d)->super_QArrayData;
        (def->type).name.d.d = (Data *)0x0;
        (def->type).name.d.ptr = (char *)0x0;
        (def->type).name.d.size = 0;
        *(undefined8 *)((long)&(def->type).rawName.d.ptr + 1) = 0;
        *(undefined8 *)((long)&(def->type).rawName.d.size + 1) = 0;
        (pQVar7->d).d = (Data *)0x0;
        (def->type).rawName.d.ptr = (char *)0x0;
        (def->type).typeTag = (QFlagsStorageHelper<TypeTag,_4>)0x0;
        (def->type).firstToken = NOTOKEN;
        (def->type).referenceType = NoReference;
        if (pQVar6 != (QArrayData *)0x0) {
          LOCK();
          (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar6,1,0x10);
          }
        }
        uVar18 = (ulong)(bVar2 >> 1);
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,1,0x10);
          }
        }
LAB_00125b66:
        if ((def->type).referenceType == Reference) {
          local_88._0_8_ = (def->type).rawName.d.d;
          local_88._8_8_ = (def->type).rawName.d.ptr;
          local_88._16_8_ = (def->type).rawName.d.size;
          if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((QArrayData *)local_88._0_8_)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((QArrayData *)local_88._0_8_)->ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QByteArray::QByteArray((QByteArray *)local_c8,anon_var_dwarf_3f0d7,-1);
          if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)local_c8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)local_c8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
            LOCK();
            (((QArrayData *)local_c8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)local_c8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pQVar4 = &((def->type).name.d.d)->super_QArrayData;
          pQVar6 = &((def->type).rawName.d.d)->super_QArrayData;
          (def->type).name.d.d = (Data *)local_c8._0_8_;
          (def->type).name.d.ptr = (char *)local_c8._8_8_;
          (def->type).name.d.size = local_c8._16_8_;
          (def->type).rawName.d.d = (Data *)local_c8._0_8_;
          (def->type).rawName.d.ptr = (char *)local_c8._8_8_;
          (def->type).rawName.d.size = local_c8._16_8_;
          (def->type).field_0x30 = 0;
          *(undefined2 *)&(def->type).field_0x31 = local_3b;
          (def->type).field_0x33 = local_39;
          (def->type).typeTag = (QFlagsStorageHelper<TypeTag,_4>)0x0;
          (def->type).firstToken = NOTOKEN;
          (def->type).referenceType = NoReference;
          if (pQVar6 != (QArrayData *)0x0) {
            LOCK();
            (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar6,1,0x10);
            }
          }
          if (pQVar4 != (QArrayData *)0x0) {
            LOCK();
            (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar4,1,0x10);
            }
          }
          if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_c8._0_8_,1,0x10);
            }
          }
          QByteArray::operator=(pQVar7,(QByteArray *)local_88);
          if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
            }
          }
        }
        normalizeType((QByteArray *)local_88,(QByteArray *)def);
        pQVar4 = &((def->normalizedType).d.d)->super_QArrayData;
        pQVar7 = (QByteArray *)(def->normalizedType).d.ptr;
        (def->normalizedType).d.d = (Data *)local_88._0_8_;
        (def->normalizedType).d.ptr = (char *)local_88._8_8_;
        pacVar3 = (char (*) [59])(def->normalizedType).d.size;
        (def->normalizedType).d.size = local_88._16_8_;
        local_88._0_8_ = pQVar4;
        local_88._8_8_ = pQVar7;
        local_88._16_8_ = pacVar3;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,1,0x10);
          }
        }
        lVar16 = (this->super_Parser).index;
        if (((this->super_Parser).symbols.d.size <= lVar16) ||
           ((this->super_Parser).symbols.d.ptr[lVar16].token != PP_RPAREN)) {
          parseFunctionArguments(this,def);
          lVar16 = (this->super_Parser).index;
          if (((this->super_Parser).symbols.d.size <= lVar16) ||
             ((this->super_Parser).symbols.d.ptr[lVar16].token != PP_RPAREN)) goto LAB_00125e49;
        }
        lVar1 = lVar16 + 1;
        (this->super_Parser).index = lVar1;
        if ((lVar1 < (this->super_Parser).symbols.d.size) &&
           ((this->super_Parser).symbols.d.ptr[lVar1].token == CONST)) {
          (this->super_Parser).index = lVar16 + 2;
          bVar14 = true;
        }
        else {
          bVar14 = false;
        }
        def->isConst = bVar14;
        bVar14 = true;
        if (((uVar18 & 1) == 0) ||
           (((def->isSignal == false && (def->isSlot == false)) && (def->isInvokable != true))))
        goto LAB_00125e4b;
        local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_c8._8_8_ = &def->name;
        local_c8._0_8_ = "parsemaybe: Function declaration ";
        local_c8._16_8_ = " contains extra qualification. Ignoring as signal or slot.";
        QStringBuilder<QStringBuilder<const_char_(&)[34],_QByteArray_&>,_const_char_(&)[59]>::
        convertTo<QByteArray>
                  ((QByteArray *)local_88,
                   (QStringBuilder<QStringBuilder<const_char_(&)[34],_QByteArray_&>,_const_char_(&)[59]>
                    *)local_c8);
        pcVar17 = (char *)local_88._8_8_;
        if ((QByteArray *)local_88._8_8_ == (QByteArray *)0x0) {
          pcVar17 = "";
        }
        Parser::warning(&this->super_Parser,pcVar17);
        if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
          }
        }
      }
    }
    else {
      if ((def->isSlot != false) || ((def->isSignal != false || (def->isInvokable == true)))) {
        do {
          bVar14 = testForFunctionModifiers(this,def);
        } while (bVar14);
      }
      local_88._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_88._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      parseType((Type *)local_88,this);
      if ((char (*) [59])local_88._16_8_ != (char (*) [59])0x0) {
        do {
          lVar16 = (this->super_Parser).index;
          if ((lVar16 < (this->super_Parser).symbols.d.size) &&
             ((this->super_Parser).symbols.d.ptr[lVar16].token == LPAREN)) break;
          switch((def->type).firstToken) {
          case Q_SIGNAL_TOKEN:
switchD_00125950_caseD_8c:
            def->isSignal = true;
            break;
          case Q_SLOT_TOKEN:
switchD_00125950_caseD_8d:
            def->isSlot = true;
            break;
          default:
            local_c8._0_8_ = "Q_SIGNAL";
            bVar14 = operator==((QByteArray *)def,(char **)local_c8);
            if (bVar14) goto switchD_00125950_caseD_8c;
            local_c8._0_8_ = "Q_SLOT";
            bVar14 = operator==((QByteArray *)def,(char **)local_c8);
            if (bVar14) goto switchD_00125950_caseD_8d;
            if ((def->tag).d.size != 0) {
              QByteArray::append(&def->tag,' ');
            }
            QByteArray::append(&def->tag,(QByteArray *)def);
            break;
          case Q_MOC_COMPAT_TOKEN:
            def->isCompat = true;
            break;
          case Q_INVOKABLE_TOKEN:
            def->isInvokable = true;
            break;
          case Q_SCRIPTABLE_TOKEN:
            def->isInvokable = true;
            def->isScriptable = true;
          }
          QByteArray::operator=((QByteArray *)def,(QByteArray *)local_88);
          QByteArray::operator=(pQVar7,(QByteArray *)(local_88 + 0x18));
          *(undefined8 *)&(def->type).field_0x30 = local_88._48_8_;
          *(undefined1 **)&(def->type).firstToken = puStack_50;
          parseType((Type *)local_c8,this);
          uVar13 = local_88._32_8_;
          data = local_88._24_8_;
          uVar12 = local_88._16_8_;
          uVar11 = local_88._8_8_;
          uVar10 = local_88._0_8_;
          uVar9 = local_c8._40_8_;
          uVar8 = local_c8._24_8_;
          local_88._0_8_ = local_c8._0_8_;
          local_88._8_8_ = local_c8._8_8_;
          local_c8._0_8_ = uVar10;
          local_c8._8_8_ = uVar11;
          local_88._16_8_ = local_c8._16_8_;
          local_c8._16_8_ = uVar12;
          local_c8._24_8_ = local_88._24_8_;
          local_88._24_8_ = uVar8;
          local_88._32_8_ = local_c8._32_8_;
          local_c8._32_8_ = uVar13;
          local_c8._40_8_ = local_88._40_8_;
          local_88._40_8_ = uVar9;
          local_88._48_8_ = local_c8._48_8_;
          puStack_50 = puStack_90;
          if ((QArrayData *)data != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)data)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)data)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)data)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)data,1,0x10);
            }
          }
          if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_c8._0_8_,1,0x10);
            }
          }
        } while ((char (*) [59])local_88._16_8_ != (char (*) [59])0x0);
      }
      lVar16 = (this->super_Parser).index;
      if ((lVar16 < (this->super_Parser).symbols.d.size) &&
         ((this->super_Parser).symbols.d.ptr[lVar16].token == LPAREN)) {
        (this->super_Parser).index = lVar16 + 1;
        bVar14 = true;
      }
      else {
        bVar14 = false;
      }
      if (bVar14) {
        QByteArray::operator=(&def->name,(QByteArray *)local_88);
        uVar18 = (ulong)local_88._48_8_ >> 1 & 0x7f;
      }
      else {
        uVar18 = 0;
      }
      if ((QArrayData *)local_88._24_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._24_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._24_8_,1,0x10);
        }
      }
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
        }
      }
      if (bVar14) goto LAB_00125b66;
    }
  }
LAB_00125e49:
  bVar14 = false;
LAB_00125e4b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar14;
  }
  __stack_chk_fail();
}

Assistant:

bool Moc::parseMaybeFunction(const ClassDef *cdef, FunctionDef *def)
{
    def->isVirtual = false;
    def->isStatic = false;
    //skip modifiers and attributes
    while (testForFunctionModifiers(def)
        || skipCxxAttributes() || testFunctionAttribute(def) || testFunctionRevision(def)) {}
    bool tilde = test(TILDE);
    def->type = parseType();
    if (def->type.name.isEmpty())
        return false;
    bool scopedFunctionName = false;
    if (test(LPAREN)) {
        def->name = def->type.name;
        scopedFunctionName = def->type.isScoped;
        if (def->name == cdef->classname) {
            def->isDestructor = tilde;
            def->isConstructor = !tilde;
            def->type = Type();
        } else {
            // missing type name? => Skip
            return false;
        }
    } else {
        // ### TODO: The condition before testForFunctionModifiers shoulnd't be necessary,
        // but otherwise we end up with misparses
        if (def->isSlot || def->isSignal || def->isInvokable)
            while (testForFunctionModifiers(def)) {}
        Type tempType = parseType();
        while (!tempType.name.isEmpty() && lookup() != LPAREN) {
            if (testFunctionAttribute(def->type.firstToken, def))
                ; // fine
            else if (def->type.name == "Q_SIGNAL")
                def->isSignal = true;
            else if (def->type.name == "Q_SLOT")
                def->isSlot = true;
            else {
                if (!def->tag.isEmpty())
                    def->tag += ' ';
                def->tag += def->type.name;
            }
            def->type = tempType;
            tempType = parseType();
        }
        if (!test(LPAREN))
            return false;
        def->name = tempType.name;
        scopedFunctionName = tempType.isScoped;
    }

    // we don't support references as return types, it's too dangerous
    if (def->type.referenceType == Type::Reference) {
        QByteArray rawName = def->type.rawName;
        def->type = Type("void");
        def->type.rawName = rawName;
    }

    def->normalizedType = normalizeType(def->type.name);

    if (!test(RPAREN)) {
        parseFunctionArguments(def);
        if (!test(RPAREN))
            return false;
    }
    def->isConst = test(CONST);
    if (scopedFunctionName
        && (def->isSignal || def->isSlot || def->isInvokable)) {
        const QByteArray msg = "parsemaybe: Function declaration " + def->name
                + " contains extra qualification. Ignoring as signal or slot.";
        warning(msg.constData());
        return false;
    }
    return true;
}